

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O3

void queue_toplevel_callback(toplevel_callback_fn_t fn,void *ctx)

{
  callback *pcVar1;
  callback **ppcVar2;
  
  pcVar1 = (callback *)safemalloc(1,0x18,0);
  pcVar1->fn = fn;
  pcVar1->ctx = ctx;
  if (((notify_frontend != (toplevel_callback_notify_fn_t)0x0) && (cbhead == (callback *)0x0)) &&
     (cbcurr == (callback *)0x0)) {
    (*notify_frontend)(notify_ctx);
  }
  ppcVar2 = &cbhead;
  if (cbtail != (callback *)0x0) {
    ppcVar2 = &cbtail->next;
  }
  ((callback *)ppcVar2)->next = pcVar1;
  cbtail = pcVar1;
  pcVar1->next = (callback *)0x0;
  return;
}

Assistant:

void queue_toplevel_callback(toplevel_callback_fn_t fn, void *ctx)
{
    struct callback *cb;

    cb = snew(struct callback);
    cb->fn = fn;
    cb->ctx = ctx;

    /*
     * If the front end has requested notification of pending
     * callbacks, and we didn't already have one queued, let it know
     * we do have one now.
     *
     * If cbcurr is non-NULL, i.e. we are actually in the middle of
     * executing a callback right now, then we count that as the queue
     * already having been non-empty. That saves the front end getting
     * a constant stream of needless re-notifications if the last
     * callback keeps re-scheduling itself.
     */
    if (notify_frontend && !cbhead && !cbcurr)
        notify_frontend(notify_ctx);

    if (cbtail)
        cbtail->next = cb;
    else
        cbhead = cb;
    cbtail = cb;
    cb->next = NULL;
}